

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_rope_yarn_corr_dims
               (int n_dims,int n_ctx_orig,float freq_base,float beta_fast,float beta_slow,
               float *dims)

{
  float *in_RDX;
  int in_EDI;
  float fVar1;
  float fVar2;
  float end;
  float start;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  fVar1 = ggml_rope_yarn_corr_dim
                    (in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8);
  fVar1 = floorf(fVar1);
  fVar2 = ggml_rope_yarn_corr_dim
                    (in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8);
  fVar2 = ceilf(fVar2);
  if (fVar1 < 0.0) {
    fVar1 = 0.0;
  }
  *in_RDX = fVar1;
  if ((float)(in_EDI + -1) < fVar2) {
    fVar2 = (float)(in_EDI + -1);
  }
  in_RDX[1] = fVar2;
  return;
}

Assistant:

void ggml_rope_yarn_corr_dims(
    int n_dims, int n_ctx_orig, float freq_base, float beta_fast, float beta_slow, float dims[2]
) {
    // start and end correction dims
    float start = floorf(ggml_rope_yarn_corr_dim(n_dims, n_ctx_orig, beta_fast, freq_base));
    float end   =  ceilf(ggml_rope_yarn_corr_dim(n_dims, n_ctx_orig, beta_slow, freq_base));
    dims[0] = MAX(0, start);
    dims[1] = MIN(n_dims - 1, end);
}